

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zg.cc
# Opt level: O2

void __thiscall
tchecker::zg::zg_t::split
          (zg_t *this,const_state_sptr_t *s,clock_constraint_t *c,
          vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>_>_>
          *v)

{
  clock_id_t dim;
  bool bVar1;
  make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *pmVar2;
  zone_t *pzVar3;
  db_t *pdVar4;
  make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL> *pmVar5;
  undefined1 auStack_48 [8];
  clock_constraint_t local_40;
  
  pmVar2 = intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           ::operator->(s);
  pzVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
            ::operator*(&(pmVar2->super_state_t)._zone)->super_zone_t;
  pdVar4 = zone_t::dbm(pzVar3);
  pmVar2 = intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           ::operator->(s);
  pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
           ::operator*(&(pmVar2->super_state_t)._zone);
  bVar1 = tchecker::dbm::satisfies(pdVar4,(pmVar5->super_zone_t)._dim,c);
  if (!bVar1) {
    local_40 = operator-(c);
    clone_and_constrain((zg_t *)auStack_48,(const_state_sptr_t *)this,(clock_constraint_t *)s);
    std::
    vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>>
    ::
    emplace_back<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>
              ((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>>
                *)v,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                     *)auStack_48);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
    ~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                *)auStack_48);
  }
  pmVar2 = intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           ::operator->(s);
  pzVar3 = &intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
            ::operator*(&(pmVar2->super_state_t)._zone)->super_zone_t;
  pdVar4 = zone_t::dbm(pzVar3);
  pmVar2 = intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           ::operator->(s);
  pmVar5 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
           ::operator*(&(pmVar2->super_state_t)._zone);
  dim = (pmVar5->super_zone_t)._dim;
  local_40 = operator-(c);
  bVar1 = tchecker::dbm::satisfies(pdVar4,dim,&stack0xffffffffffffffc0);
  if (!bVar1) {
    clone_and_constrain((zg_t *)&stack0xffffffffffffffc0,(const_state_sptr_t *)this,
                        (clock_constraint_t *)s);
    std::
    vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>>
    ::
    emplace_back<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>
              ((vector<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>,std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>>>
                *)v,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                     *)&stack0xffffffffffffffc0);
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
    ~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
                *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void zg_t::split(tchecker::zg::const_state_sptr_t const & s, tchecker::clock_constraint_t const & c,
                 std::vector<tchecker::zg::state_sptr_t> & v)
{
  if (!tchecker::dbm::satisfies(s->zone().dbm(), s->zone().dim(), c))
    v.push_back(clone_and_constrain(s, -c));
  if (!tchecker::dbm::satisfies(s->zone().dbm(), s->zone().dim(), -c))
    v.push_back(clone_and_constrain(s, c));
}